

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::Configurations::setRemainingToDefault(Configurations *this)

{
  allocator<char> local_29;
  string local_28;
  
  (*(this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .super_ThreadSafe._vptr_ThreadSafe[2])();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"true",&local_29);
  unsafeSetIfNotExist(this,Global,Enabled,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"logs/myeasylog.log",&local_29);
  unsafeSetIfNotExist(this,Global,Filename,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"true",&local_29);
  unsafeSetIfNotExist(this,Global,ToStandardOutput,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"3",&local_29);
  unsafeSetIfNotExist(this,Global,MillisecondsWidth,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"true",&local_29);
  unsafeSetIfNotExist(this,Global,PerformanceTracking,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"0",&local_29);
  unsafeSetIfNotExist(this,Global,MaxLogFileSize,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"%datetime %level [%logger] %msg",&local_29);
  unsafeSetIfNotExist(this,Global,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"%datetime %level [%logger] [%user@%host] [%func] [%loc] %msg",
             &local_29);
  unsafeSetIfNotExist(this,Debug,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"%datetime %level [%logger] %msg",&local_29);
  unsafeSetIfNotExist(this,Error,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"%datetime %level [%logger] %msg",&local_29);
  unsafeSetIfNotExist(this,Fatal,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"%datetime %level-%vlevel [%logger] %msg",&local_29);
  unsafeSetIfNotExist(this,Verbose,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"%datetime %level [%logger] [%func] [%loc] %msg",&local_29);
  unsafeSetIfNotExist(this,Trace,Format,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void Configurations::setRemainingToDefault(void) {
  base::threading::ScopedLock scopedLock(lock());
#if defined(ELPP_NO_LOG_TO_FILE)
  unsafeSetIfNotExist(Level::Global, ConfigurationType::Enabled, std::string("false"));
#else
  unsafeSetIfNotExist(Level::Global, ConfigurationType::Enabled, std::string("true"));
#endif // defined(ELPP_NO_LOG_TO_FILE)
#if !defined(ELPP_NO_DEFAULT_LOG_FILE)
  unsafeSetIfNotExist(Level::Global, ConfigurationType::Filename, std::string(base::consts::kDefaultLogFile));
#endif  // !defined(ELPP_NO_DEFAULT_LOG_FILE)
  unsafeSetIfNotExist(Level::Global, ConfigurationType::ToStandardOutput, std::string("true"));
  unsafeSetIfNotExist(Level::Global, ConfigurationType::SubsecondPrecision, std::string("3"));
  unsafeSetIfNotExist(Level::Global, ConfigurationType::PerformanceTracking, std::string("true"));
  unsafeSetIfNotExist(Level::Global, ConfigurationType::MaxLogFileSize, std::string("0"));
  unsafeSetIfNotExist(Level::Global, ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"));
  unsafeSetIfNotExist(Level::Debug, ConfigurationType::Format,
                      std::string("%datetime %level [%logger] [%user@%host] [%func] [%loc] %msg"));
  // INFO and WARNING are set to default by Level::Global
  unsafeSetIfNotExist(Level::Error, ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"));
  unsafeSetIfNotExist(Level::Fatal, ConfigurationType::Format, std::string("%datetime %level [%logger] %msg"));
  unsafeSetIfNotExist(Level::Verbose, ConfigurationType::Format, std::string("%datetime %level-%vlevel [%logger] %msg"));
  unsafeSetIfNotExist(Level::Trace, ConfigurationType::Format,
                      std::string("%datetime %level [%logger] [%func] [%loc] %msg"));
}